

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)35,_(unsigned_short)30>::Unpack
               (uint32_t **in,uint64_t *out)

{
  uint64_t *in_RSI;
  uint32_t **in_RDI;
  
  unpack_single_out<(unsigned_char)35,(unsigned_char)26>(in_RDI,in_RSI + 0x1e);
  Unroller<(unsigned_short)35,_(unsigned_short)31>::Unpack(*in_RDI,in_RSI);
  return;
}

Assistant:

static void Unpack(const uint32_t *__restrict &in, uint64_t *__restrict out) {
		unpack_single_out<DELTA, (DELTA * OINDEX) % 32>(in, out + OINDEX);

		Unroller<DELTA, OINDEX + 1>::Unpack(in, out);
	}